

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O1

void __thiscall SubprocessSet::~SubprocessSet(SubprocessSet *this)

{
  pointer ppSVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *msg;
  
  Clear(this);
  iVar2 = sigaction(2,(sigaction *)&this->old_int_act_,(sigaction *)0x0);
  msg = "sigaction: %s";
  if (-1 < iVar2) {
    iVar2 = sigaction(0xf,(sigaction *)&this->old_term_act_,(sigaction *)0x0);
    if (-1 < iVar2) {
      iVar2 = sigaction(1,(sigaction *)&this->old_hup_act_,(sigaction *)0x0);
      if (-1 < iVar2) {
        iVar2 = sigprocmask(2,(sigset_t *)&this->old_mask_,(sigset_t *)0x0);
        if (-1 < iVar2) {
          std::_Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>::~_Deque_base
                    ((_Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_> *)&this->finished_);
          ppSVar1 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar1 != (pointer)0x0) {
            operator_delete(ppSVar1,(long)(this->running_).
                                          super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)ppSVar1);
            return;
          }
          return;
        }
        msg = "sigprocmask: %s";
      }
    }
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  Fatal(msg,pcVar4);
}

Assistant:

SubprocessSet::~SubprocessSet() {
  Clear();

  if (sigaction(SIGINT, &old_int_act_, 0) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGTERM, &old_term_act_, 0) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGHUP, &old_hup_act_, 0) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigprocmask(SIG_SETMASK, &old_mask_, 0) < 0)
    Fatal("sigprocmask: %s", strerror(errno));
}